

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.c
# Opt level: O1

size_t ZSTD_compressEnd(ZSTD_CCtx *cctx,void *dst,size_t dstCapacity,void *src,size_t srcSize)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  size_t sVar4;
  XXH64_hash_t XVar5;
  ulong uVar6;
  ulong uVar7;
  size_t sVar8;
  ulong uVar9;
  undefined4 *puVar10;
  undefined4 *puVar11;
  
  sVar4 = ZSTD_compressContinue_internal(cctx,dst,dstCapacity,src,srcSize,1,1);
  if (0xffffffffffffff88 < sVar4) {
    return sVar4;
  }
  if (cctx->stage == ZSTDcs_created) {
    uVar6 = 0xffffffffffffffc4;
  }
  else {
    puVar11 = (undefined4 *)((long)dst + sVar4);
    uVar9 = dstCapacity - sVar4;
    puVar10 = puVar11;
    if (cctx->stage == ZSTDcs_init) {
      iVar1 = (cctx->appliedParams).fParams.contentSizeFlag;
      iVar2 = (cctx->appliedParams).fParams.checksumFlag;
      uVar6 = 0xffffffffffffffba;
      if (0x11 < uVar9) {
        uVar3 = (cctx->appliedParams).cParams.windowLog;
        if ((cctx->appliedParams).format == ZSTD_f_zstd1) {
          *puVar11 = 0xfd2fb528;
          uVar6 = 4;
        }
        else {
          uVar6 = 0;
        }
        uVar7 = uVar6 | 1;
        *(char *)((long)puVar11 + uVar6) = (iVar1 != 0) << 5 | (0 < iVar2) << 2;
        if (iVar1 == 0) {
          uVar6 = uVar6 | 2;
          *(char *)((long)puVar11 + uVar7) = (char)uVar3 * '\b' + -0x50;
        }
        else {
          *(undefined1 *)((long)puVar11 + uVar7) = 0;
          uVar6 = uVar7 + 1;
        }
      }
      if (0xffffffffffffff88 < uVar6) goto LAB_0041a3db;
      uVar9 = uVar9 - uVar6;
      cctx->stage = ZSTDcs_ongoing;
      puVar10 = (undefined4 *)(uVar6 + (long)puVar11);
    }
    uVar7 = uVar9;
    if (cctx->stage != ZSTDcs_ending) {
      if (3 < uVar9) {
        *puVar10 = 1;
        puVar10 = (undefined4 *)((long)puVar10 + 3);
        uVar7 = uVar9 - 3;
      }
      uVar6 = 0xffffffffffffffba;
      if (uVar9 < 4) goto LAB_0041a3db;
    }
    if ((cctx->appliedParams).fParams.checksumFlag != 0) {
      XVar5 = XXH64_digest(&cctx->xxhState);
      if (3 < uVar7) {
        *puVar10 = (int)XVar5;
        puVar10 = puVar10 + 1;
      }
      uVar6 = 0xffffffffffffffba;
      if (uVar7 < 4) goto LAB_0041a3db;
    }
    cctx->stage = ZSTDcs_created;
    uVar6 = (long)puVar10 - (long)puVar11;
  }
LAB_0041a3db:
  sVar8 = uVar6;
  if ((uVar6 < 0xffffffffffffff89) &&
     ((cctx->pledgedSrcSizePlusOne == 0 ||
      (sVar8 = 0xffffffffffffffb8, cctx->pledgedSrcSizePlusOne == cctx->consumedSrcSize + 1)))) {
    sVar8 = uVar6 + sVar4;
  }
  return sVar8;
}

Assistant:

size_t ZSTD_compressEnd (ZSTD_CCtx* cctx,
                         void* dst, size_t dstCapacity,
                   const void* src, size_t srcSize)
{
    size_t endResult;
    size_t const cSize = ZSTD_compressContinue_internal(cctx,
                                dst, dstCapacity, src, srcSize,
                                1 /* frame mode */, 1 /* last chunk */);
    if (ZSTD_isError(cSize)) return cSize;
    endResult = ZSTD_writeEpilogue(cctx, (char*)dst + cSize, dstCapacity-cSize);
    if (ZSTD_isError(endResult)) return endResult;
    assert(!(cctx->appliedParams.fParams.contentSizeFlag && cctx->pledgedSrcSizePlusOne == 0));
    if (cctx->pledgedSrcSizePlusOne != 0) {  /* control src size */
        ZSTD_STATIC_ASSERT(ZSTD_CONTENTSIZE_UNKNOWN == (unsigned long long)-1);
        DEBUGLOG(4, "end of frame : controlling src size");
        if (cctx->pledgedSrcSizePlusOne != cctx->consumedSrcSize+1) {
            DEBUGLOG(4, "error : pledgedSrcSize = %u, while realSrcSize = %u",
                (unsigned)cctx->pledgedSrcSizePlusOne-1, (unsigned)cctx->consumedSrcSize);
            return ERROR(srcSize_wrong);
    }   }
    return cSize + endResult;
}